

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O3

void __thiscall Board::set_position(Board *this,Ship *ship)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  
  if ((ship->length == 1) && (ship->ID == 'S')) {
    lVar11 = *(long *)&(this->matrix).
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[ship->sRow].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data;
    lVar8 = (long)ship->sCol * 0x20;
    std::__cxx11::string::_M_replace(lVar11 + lVar8,0,*(char **)(lVar11 + 8 + lVar8),0x1060f5);
  }
  if (ship->orientation == 'V') {
    if (ship->direction == -2) {
      iVar5 = ship->length;
      if (0 < iVar5) {
        iVar3 = ship->sRow;
        lVar8 = (long)iVar3;
        lVar11 = lVar8 * 0x18;
        do {
          if ((int)lVar8 == iVar3) {
            lVar2 = *(long *)((long)&(((this->matrix).
                                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data + lVar11);
            lVar7 = (long)ship->sCol * 0x20;
            uVar4 = lVar2 + lVar7;
            pcVar9 = *(char **)(lVar2 + 8 + lVar7);
            pcVar6 = anon_var_dwarf_44a3;
          }
          else {
            lVar2 = *(long *)((long)&(((this->matrix).
                                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data + lVar11);
            lVar7 = (long)ship->sCol * 0x20;
            uVar4 = lVar2 + lVar7;
            pcVar9 = *(char **)(lVar2 + 8 + lVar7);
            if ((int)lVar8 == (iVar3 - iVar5) + 1) {
              pcVar6 = anon_var_dwarf_4499;
            }
            else {
              pcVar6 = anon_var_dwarf_448f;
            }
          }
          std::__cxx11::string::_M_replace(uVar4,0,pcVar9,(ulong)pcVar6);
          lVar8 = lVar8 + -1;
          iVar5 = ship->length;
          iVar3 = ship->sRow;
          lVar11 = lVar11 + -0x18;
        } while (iVar3 - iVar5 < lVar8);
      }
    }
    else if ((ship->direction == 2) && (0 < ship->length)) {
      uVar1 = ship->sRow;
      uVar10 = (ulong)uVar1;
      uVar4 = (ulong)(ship->length + uVar1);
      lVar8 = (long)(int)uVar1;
      lVar11 = lVar8 * 0x18;
      do {
        if ((int)lVar8 == (int)uVar10) {
          lVar2 = *(long *)((long)&(((this->matrix).
                                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data + lVar11);
          lVar7 = (long)ship->sCol * 0x20;
          uVar10 = lVar2 + lVar7;
          pcVar9 = *(char **)(lVar2 + 8 + lVar7);
          pcVar6 = anon_var_dwarf_4499;
        }
        else {
          lVar2 = *(long *)((long)&(((this->matrix).
                                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data + lVar11);
          lVar7 = (long)ship->sCol * 0x20;
          uVar10 = lVar2 + lVar7;
          pcVar9 = *(char **)(lVar2 + 8 + lVar7);
          if ((int)lVar8 == (int)uVar4 + -1) {
            pcVar6 = anon_var_dwarf_44a3;
          }
          else {
            pcVar6 = anon_var_dwarf_448f;
          }
        }
        std::__cxx11::string::_M_replace(uVar10,0,pcVar9,(ulong)pcVar6);
        lVar8 = lVar8 + 1;
        uVar10 = (ulong)ship->sRow;
        uVar4 = (long)ship->length + uVar10;
        lVar11 = lVar11 + 0x18;
      } while (lVar8 < (long)uVar4);
    }
  }
  else if (ship->orientation == 'H') {
    if (ship->direction == -1) {
      iVar5 = ship->length;
      if (0 < iVar5) {
        iVar3 = ship->sCol;
        lVar11 = (long)iVar3;
        lVar8 = lVar11 << 5;
        do {
          if ((int)lVar11 == iVar3) {
            lVar2 = *(long *)&(this->matrix).
                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[ship->sRow].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            pcVar9 = *(char **)(lVar2 + 8 + lVar8);
            uVar4 = lVar2 + lVar8;
            pcVar6 = anon_var_dwarf_4485;
          }
          else {
            lVar2 = *(long *)&(this->matrix).
                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[ship->sRow].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            uVar4 = lVar2 + lVar8;
            pcVar9 = *(char **)(lVar2 + 8 + lVar8);
            if ((int)lVar11 == (iVar3 - iVar5) + 1) {
              pcVar6 = anon_var_dwarf_447b;
            }
            else {
              pcVar6 = anon_var_dwarf_448f;
            }
          }
          std::__cxx11::string::_M_replace(uVar4,0,pcVar9,(ulong)pcVar6);
          lVar11 = lVar11 + -1;
          iVar5 = ship->length;
          iVar3 = ship->sCol;
          lVar8 = lVar8 + -0x20;
        } while (iVar3 - iVar5 < lVar11);
      }
    }
    else if ((ship->direction == 1) && (0 < ship->length)) {
      uVar1 = ship->sCol;
      uVar10 = (ulong)uVar1;
      uVar4 = (ulong)(ship->length + uVar1);
      lVar11 = (long)(int)uVar1;
      lVar8 = lVar11 << 5;
      do {
        if ((int)lVar11 == (int)uVar10) {
          lVar2 = *(long *)&(this->matrix).
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[ship->sRow].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          pcVar9 = *(char **)(lVar2 + 8 + lVar8);
          uVar10 = lVar2 + lVar8;
          pcVar6 = anon_var_dwarf_447b;
        }
        else {
          lVar2 = *(long *)&(this->matrix).
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[ship->sRow].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          uVar10 = lVar2 + lVar8;
          pcVar9 = *(char **)(lVar2 + 8 + lVar8);
          if ((int)lVar11 == (int)uVar4 + -1) {
            pcVar6 = anon_var_dwarf_4485;
          }
          else {
            pcVar6 = anon_var_dwarf_448f;
          }
        }
        std::__cxx11::string::_M_replace(uVar10,0,pcVar9,(ulong)pcVar6);
        lVar11 = lVar11 + 1;
        uVar10 = (ulong)ship->sCol;
        uVar4 = (long)ship->length + uVar10;
        lVar8 = lVar8 + 0x20;
      } while (lVar11 < (long)uVar4);
    }
  }
  return;
}

Assistant:

void set_position( Ship *ship )
        {
            if( ship->length == 1 and ship->ID == 'S')
            {
                matrix[ship->sRow][ship->sCol] = "⬤";
            }

            if( ship->orientation == 'H' )
            {
                if( ship->direction == 1 )
                {
                    for( int j = ship->sCol; j < ship->sCol + ship->length; j++ )
                    {
                        if( j == ship->sCol )
                        {
                            matrix[ship->sRow][j] = "◀";
                        }
                        else if( j == ship->sCol + ship->length - 1 )
                        {
                            matrix[ship->sRow][j] = "▶";
                        }
                        else
                        {
                            matrix[ship->sRow][j] = "■";
                        }
                    }
                }
                else if( ship->direction == -1 )
                { 
                    for( int j = ship->sCol; j > ship->sCol - ship->length; j-- )
                    { 
                        if( j == ship->sCol )
                        {
                            matrix[ship->sRow][j] = "▶";
                        }
                        else if( j == ship->sCol - ( ship->length - 1 ) )
                        {
                            matrix[ship->sRow][j] = "◀";
                        }
                        else
                        {
                            matrix[ship->sRow][j] = "■";
                        }
                    }
                }
            }
            else if( ship->orientation == 'V' )
            {
                if( ship->direction == 2 )
                {
                    for( int i = ship->sRow; i < ship->sRow + ship->length; i++ )
                    {
                        if( i == ship->sRow )
                        {
                            matrix[i][ship->sCol] = "▲";
                        }
                        else if( i == ship->sRow + ship->length - 1 )
                        {
                            matrix[i][ship->sCol] = "▼";
                        }
                        else
                        {
                            matrix[i][ship->sCol] = "■";
                        }
                    }
                }
                else if( ship->direction == -2 )
                {
                    for( int i = ship->sRow; i > ship->sRow - ship->length; i-- )
                    { 
                        if( i == ship->sRow )
                        {
                            matrix[i][ship->sCol] = "▼";
                        }
                        else if( i == ship->sRow - ( ship->length - 1 ) )
                        {
                            matrix[i][ship->sCol] = "▲";
                        }
                        else
                        {
                            matrix[i][ship->sCol] = "■";
                        }
                    }
                }
             }
        }